

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flvtag_avcwritenal(flvtag_t *tag,uint8_t *data,size_t size)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint8_t *payload;
  uint32_t flvsize;
  size_t size_local;
  uint8_t *data_local;
  flvtag_t *tag_local;
  
  if (size != 0) {
    sVar1 = flvtag_size(tag);
    flvtag_reserve(tag,(int)sVar1 + 4 + (int)size);
    puVar2 = tag->data + (sVar1 & 0xffffffff) + 0xb;
    *puVar2 = (uint8_t)(size >> 0x18);
    puVar2[1] = (uint8_t)(size >> 0x10);
    puVar2[2] = (uint8_t)(size >> 8);
    puVar2[3] = (uint8_t)size;
    memcpy(puVar2 + 4,data,size);
    flvtag_updatesize(tag,(int)sVar1 + 4 + (int)size);
  }
  return 1;
}

Assistant:

int flvtag_avcwritenal(flvtag_t* tag, uint8_t* data, size_t size)
{
    if (0 < size) {
        uint32_t flvsize = flvtag_size(tag);
        flvtag_reserve(tag, flvsize + LENGTH_SIZE + size);
        uint8_t* payload = tag->data + FLV_TAG_HEADER_SIZE + flvsize;
        payload[0] = size >> 24; // nalu size
        payload[1] = size >> 16;
        payload[2] = size >> 8;
        payload[3] = size >> 0;
        memcpy(&payload[LENGTH_SIZE], data, size);
        flvtag_updatesize(tag, flvsize + LENGTH_SIZE + size);
    }
    return 1;
}